

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_dynamic.cpp
# Opt level: O1

bool __thiscall
ritobin::io::compat_impl::BinCompatLatest::raw_to_type(BinCompatLatest *this,uint8_t raw,Type *type)

{
  byte bVar1;
  
  *type = raw;
  bVar1 = 0x13;
  if ((char)raw < '\0') {
    bVar1 = 0x88;
  }
  return raw < bVar1;
}

Assistant:

bool raw_to_type(uint8_t raw, Type &type) const noexcept override {
            type = static_cast<Type>(raw);
            if (ValueHelper::is_primitive(type)) {
                if (type <= ValueHelper::MAX_PRIMITIVE) {
                    return true;
                } else {
                    return false;
                }
            } else {
                if (type <= ValueHelper::MAX_COMPLEX) {
                    return true;
                } else {
                    return false;
                }
            }
        }